

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsbit.c
# Opt level: O0

FT_Error tt_sbit_decoder_load_metrics
                   (TT_SBitDecoder decoder,FT_Byte **pp,FT_Byte *limit,FT_Bool big)

{
  byte *pbVar1;
  TT_SBit_Metrics pTVar2;
  TT_SBit_Metrics metrics;
  FT_Byte *p;
  FT_Bool big_local;
  FT_Byte *limit_local;
  FT_Byte **pp_local;
  TT_SBitDecoder decoder_local;
  
  pbVar1 = *pp;
  pTVar2 = decoder->metrics;
  if (limit < pbVar1 + 5) {
LAB_003282e5:
    decoder_local._4_4_ = 6;
  }
  else {
    pTVar2->height = (ushort)*pbVar1;
    pTVar2->width = (ushort)pbVar1[1];
    pTVar2->horiBearingX = (short)(char)pbVar1[2];
    pTVar2->horiBearingY = (short)(char)pbVar1[3];
    pTVar2->horiAdvance = (ushort)pbVar1[4];
    metrics = (TT_SBit_Metrics)(pbVar1 + 5);
    if (big == '\0') {
      pTVar2->vertBearingX = 0;
      pTVar2->vertBearingY = 0;
      pTVar2->vertAdvance = 0;
    }
    else {
      if (limit < pbVar1 + 8) goto LAB_003282e5;
      pTVar2->vertBearingX = (short)(char)(byte)metrics->height;
      pTVar2->vertBearingY = (short)(char)pbVar1[6];
      pTVar2->vertAdvance = (ushort)pbVar1[7];
      metrics = (TT_SBit_Metrics)(pbVar1 + 8);
    }
    decoder->metrics_loaded = '\x01';
    *pp = (FT_Byte *)metrics;
    decoder_local._4_4_ = 0;
  }
  return decoder_local._4_4_;
}

Assistant:

static FT_Error
  tt_sbit_decoder_load_metrics( TT_SBitDecoder  decoder,
                                FT_Byte*       *pp,
                                FT_Byte*        limit,
                                FT_Bool         big )
  {
    FT_Byte*         p       = *pp;
    TT_SBit_Metrics  metrics = decoder->metrics;


    if ( p + 5 > limit )
      goto Fail;

    metrics->height       = p[0];
    metrics->width        = p[1];
    metrics->horiBearingX = (FT_Char)p[2];
    metrics->horiBearingY = (FT_Char)p[3];
    metrics->horiAdvance  = p[4];

    p += 5;
    if ( big )
    {
      if ( p + 3 > limit )
        goto Fail;

      metrics->vertBearingX = (FT_Char)p[0];
      metrics->vertBearingY = (FT_Char)p[1];
      metrics->vertAdvance  = p[2];

      p += 3;
    }
    else
    {
      /* avoid uninitialized data in case there is no vertical info -- */
      metrics->vertBearingX = 0;
      metrics->vertBearingY = 0;
      metrics->vertAdvance  = 0;
    }

    decoder->metrics_loaded = 1;
    *pp = p;
    return FT_Err_Ok;

  Fail:
    FT_TRACE1(( "tt_sbit_decoder_load_metrics: broken table\n" ));
    return FT_THROW( Invalid_Argument );
  }